

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::stackUnder_sys(QWidgetPrivate *this,QWidget *param_2)

{
  long lVar1;
  QWidgetPrivate *this_00;
  QWidget *pQVar2;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *p;
  QWidget *q;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  pQVar2 = QWidget::parentWidget((QWidget *)0x380e1e);
  if (pQVar2 != (QWidget *)0x0) {
    setDirtyOpaqueRegion(this_00);
    QWidget::d_func((QWidget *)0x380e3f);
    QWidget::geometry((QWidget *)this_00);
    effectiveRectFor(in_RSI,(QRect *)this_00);
    invalidateBackingStore<QRect>(in_RDI,(QRect *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::stackUnder_sys(QWidget*)
{
    Q_Q(QWidget);
    if (QWidget *p = q->parentWidget()) {
        setDirtyOpaqueRegion();
        p->d_func()->invalidateBackingStore(effectiveRectFor(q->geometry()));
    }
}